

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryScatter<duckdb::ModeState<int,duckdb::ModeStandard<int>>,int,duckdb::EntropyFunction<duckdb::ModeStandard<int>>>
               (Vector *input,Vector *states,AggregateInputData *aggr_input_data,idx_t count)

{
  unsigned_long *puVar1;
  data_ptr_t pdVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  idx_t iVar7;
  ulong uVar8;
  int *piVar9;
  int *key;
  AggregateUnaryInput input_data;
  UnifiedVectorFormat sdata;
  ulong local_f8;
  UnifiedVectorFormat local_c0;
  UnifiedVectorFormat local_78;
  
  if (input->vector_type == FLAT_VECTOR) {
    if (states->vector_type == FLAT_VECTOR) {
      key = (int *)input->data;
      pdVar2 = states->data;
      FlatVector::VerifyFlatVector(input);
      if ((input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        if (count == 0) {
          return;
        }
        iVar7 = 0;
        do {
          BaseModeFunction<duckdb::ModeStandard<int>>::
          Execute<int,duckdb::ModeState<int,duckdb::ModeStandard<int>>,duckdb::EntropyFunction<duckdb::ModeStandard<int>>>
                    (*(ModeState<int,_duckdb::ModeStandard<int>_> **)(pdVar2 + iVar7 * 8),key,
                     aggr_input_data);
          iVar7 = iVar7 + 1;
          key = key + 1;
        } while (count != iVar7);
        return;
      }
      if (count + 0x3f < 0x40) {
        return;
      }
      local_f8 = 0;
      uVar5 = 0;
      do {
        puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar1 == (unsigned_long *)0x0) {
          uVar3 = uVar5 + 0x40;
          if (count <= uVar5 + 0x40) {
            uVar3 = count;
          }
LAB_00e89e62:
          uVar6 = uVar5;
          if (uVar5 < uVar3) {
            piVar9 = key + uVar5;
            do {
              BaseModeFunction<duckdb::ModeStandard<int>>::
              Execute<int,duckdb::ModeState<int,duckdb::ModeStandard<int>>,duckdb::EntropyFunction<duckdb::ModeStandard<int>>>
                        (*(ModeState<int,_duckdb::ModeStandard<int>_> **)(pdVar2 + uVar5 * 8),piVar9
                         ,aggr_input_data);
              uVar5 = uVar5 + 1;
              piVar9 = piVar9 + 1;
              uVar6 = uVar3;
            } while (uVar3 != uVar5);
          }
        }
        else {
          uVar4 = puVar1[local_f8];
          uVar3 = uVar5 + 0x40;
          if (count <= uVar5 + 0x40) {
            uVar3 = count;
          }
          if (uVar4 == 0xffffffffffffffff) goto LAB_00e89e62;
          uVar6 = uVar3;
          if ((uVar4 != 0) && (uVar6 = uVar5, uVar5 < uVar3)) {
            piVar9 = key + uVar5;
            uVar8 = 0;
            do {
              if ((uVar4 >> (uVar8 & 0x3f) & 1) != 0) {
                BaseModeFunction<duckdb::ModeStandard<int>>::
                Execute<int,duckdb::ModeState<int,duckdb::ModeStandard<int>>,duckdb::EntropyFunction<duckdb::ModeStandard<int>>>
                          (*(ModeState<int,_duckdb::ModeStandard<int>_> **)
                            (pdVar2 + uVar8 * 8 + uVar5 * 8),piVar9,aggr_input_data);
              }
              uVar8 = uVar8 + 1;
              piVar9 = piVar9 + 1;
              uVar6 = uVar3;
            } while (uVar3 - uVar5 != uVar8);
          }
        }
        local_f8 = local_f8 + 1;
        uVar5 = uVar6;
        if (local_f8 == count + 0x3f >> 6) {
          return;
        }
      } while( true );
    }
  }
  else if ((input->vector_type == CONSTANT_VECTOR) && (states->vector_type == CONSTANT_VECTOR)) {
    puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar1 != (unsigned_long *)0x0) && ((*puVar1 & 1) == 0)) {
      return;
    }
    local_c0.data = (data_ptr_t)&input->validity;
    local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
         (unsigned_long *)0x0;
    local_c0.sel = (SelectionVector *)aggr_input_data;
    TypedModeFunction<duckdb::ModeStandard<int>>::
    ConstantOperation<int,duckdb::ModeState<int,duckdb::ModeStandard<int>>,duckdb::EntropyFunction<duckdb::ModeStandard<int>>>
              (*(ModeState<int,_duckdb::ModeStandard<int>_> **)states->data,(int *)input->data,
               (AggregateUnaryInput *)&local_c0,count);
    return;
  }
  UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(input,count,&local_c0);
  Vector::ToUnifiedFormat(states,count,&local_78);
  if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    if (count != 0) {
      uVar5 = 0;
      do {
        uVar3 = uVar5;
        if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
          uVar3 = (ulong)(local_c0.sel)->sel_vector[uVar5];
        }
        uVar4 = uVar5;
        if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
          uVar4 = (ulong)(local_78.sel)->sel_vector[uVar5];
        }
        BaseModeFunction<duckdb::ModeStandard<int>>::
        Execute<int,duckdb::ModeState<int,duckdb::ModeStandard<int>>,duckdb::EntropyFunction<duckdb::ModeStandard<int>>>
                  (*(ModeState<int,_duckdb::ModeStandard<int>_> **)(local_78.data + uVar4 * 8),
                   (int *)(local_c0.data + uVar3 * 4),aggr_input_data);
        uVar5 = uVar5 + 1;
      } while (count != uVar5);
    }
  }
  else if (count != 0) {
    uVar5 = 0;
    do {
      uVar3 = uVar5;
      if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
        uVar3 = (ulong)(local_c0.sel)->sel_vector[uVar5];
      }
      uVar4 = uVar5;
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        uVar4 = (ulong)(local_78.sel)->sel_vector[uVar5];
      }
      if ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0) ||
         ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar3 >> 6] >>
           (uVar3 & 0x3f) & 1) != 0)) {
        BaseModeFunction<duckdb::ModeStandard<int>>::
        Execute<int,duckdb::ModeState<int,duckdb::ModeStandard<int>>,duckdb::EntropyFunction<duckdb::ModeStandard<int>>>
                  (*(ModeState<int,_duckdb::ModeStandard<int>_> **)(local_78.data + uVar4 * 8),
                   (int *)(local_c0.data + uVar3 * 4),aggr_input_data);
      }
      uVar5 = uVar5 + 1;
    } while (count != uVar5);
  }
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_c0.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void UnaryScatter(Vector &input, Vector &states, AggregateInputData &aggr_input_data, idx_t count) {
		if (input.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				// constant NULL input in function that ignores NULL values
				return;
			}
			// regular constant: get first state
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(**sdata, *idata, input_data, count);
#ifndef DUCKDB_SMALLER_BINARY
		} else if (input.GetVectorType() == VectorType::FLAT_VECTOR &&
		           states.GetVectorType() == VectorType::FLAT_VECTOR) {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			UnaryFlatLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, sdata, FlatVector::Validity(input),
			                                          count);
#endif
		} else {
			UnifiedVectorFormat idata, sdata;
			input.ToUnifiedFormat(count, idata);
			states.ToUnifiedFormat(count, sdata);
			UnaryScatterLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                             aggr_input_data, (STATE_TYPE **)sdata.data, *idata.sel,
			                                             *sdata.sel, idata.validity, count);
		}
	}